

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

cmd_ln_t * parse_options(cmd_ln_t *cmdln,arg_t *defn,int32 argc,char **argv,int32 strict)

{
  char **ppcVar1;
  int local_44;
  int32 i;
  cmd_ln_t *new_cmdln;
  int32 strict_local;
  char **argv_local;
  int32 argc_local;
  arg_t *defn_local;
  cmd_ln_t *cmdln_local;
  
  cmdln_local = cmd_ln_parse_r(cmdln,defn,argc,argv,strict);
  if (cmdln_local == (cmd_ln_t *)0x0) {
    for (local_44 = 0; local_44 < argc; local_44 = local_44 + 1) {
      ckd_free(argv[local_44]);
    }
    ckd_free(argv);
    cmdln_local = (cmd_ln_t *)0x0;
  }
  else if (cmdln_local == cmdln) {
    ppcVar1 = (char **)__ckd_realloc__(cmdln_local->f_argv,(ulong)(cmdln_local->f_argc + argc) << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x1ca);
    cmdln_local->f_argv = ppcVar1;
    memcpy(cmdln_local->f_argv + cmdln_local->f_argc,argv,(long)argc << 3);
    ckd_free(argv);
    cmdln_local->f_argc = argc + cmdln_local->f_argc;
  }
  else {
    cmdln_local->f_argc = argc;
    cmdln_local->f_argv = argv;
  }
  return cmdln_local;
}

Assistant:

static cmd_ln_t *
parse_options(cmd_ln_t *cmdln, const arg_t *defn, int32 argc, char* argv[], int32 strict)
{
    cmd_ln_t *new_cmdln;

    new_cmdln = cmd_ln_parse_r(cmdln, defn, argc, argv, strict);
    /* If this failed then clean up and return NULL. */
    if (new_cmdln == NULL) {
        int32 i;
        for (i = 0; i < argc; ++i)
            ckd_free(argv[i]);
        ckd_free(argv);
        return NULL;
    }

    /* Otherwise, we need to add the contents of f_argv to the new object. */
    if (new_cmdln == cmdln) {
        /* If we are adding to a previously passed-in cmdln, then
         * store our allocated strings in its f_argv. */
        new_cmdln->f_argv = (char **)ckd_realloc(new_cmdln->f_argv,
                                        (new_cmdln->f_argc + argc)
                                        * sizeof(*new_cmdln->f_argv));
        memcpy(new_cmdln->f_argv + new_cmdln->f_argc, argv,
               argc * sizeof(*argv));
        ckd_free(argv);
        new_cmdln->f_argc += argc;
    }
    else {
        /* Otherwise, store f_argc and f_argv. */
        new_cmdln->f_argc = argc;
        new_cmdln->f_argv = argv;
    }

    return new_cmdln;
}